

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assembler.cpp
# Opt level: O3

void __thiscall
Assembler::processLdStrAbsolute(Assembler *this,string *instruction,int reg,string *operand)

{
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __s;
  pointer pcVar1;
  bool bVar2;
  int iVar3;
  Assembler *this_00;
  _Alloc_hider _Var4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  undefined1 local_d8 [72];
  pointer pcStack_90;
  pointer local_88;
  undefined8 uStack_80;
  string local_70;
  string local_50;
  
  this_00 = (Assembler *)local_d8;
  __s._M_current = (operand->_M_dataplus)._M_p;
  local_88 = (pointer)0x0;
  uStack_80._0_1_ = false;
  uStack_80._1_7_ = 0;
  local_d8._64_8_ = (pointer)0x0;
  pcStack_90 = (pointer)0x0;
  bVar2 = std::__detail::
          __regex_algo_impl<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>,(std::__detail::_RegexExecutorPolicy)0,true>
                    (__s,(__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          )(__s._M_current + operand->_M_string_length),
                     (match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                      *)(local_d8 + 0x40),&symbolReg_abi_cxx11_,0);
  if ((pointer)local_d8._64_8_ != (pointer)0x0) {
    operator_delete((void *)local_d8._64_8_,(long)local_88 - local_d8._64_8_);
  }
  if (bVar2) {
    pcVar1 = (operand->_M_dataplus)._M_p;
    local_d8._32_8_ = local_d8 + 0x30;
    std::__cxx11::string::_M_construct<char*>
              ((string *)(local_d8 + 0x20),pcVar1,pcVar1 + operand->_M_string_length);
    iVar3 = processAbsoluteAddressingSymbol(this,(string *)(local_d8 + 0x20));
    if ((undefined1 *)local_d8._32_8_ != local_d8 + 0x30) {
      operator_delete((void *)local_d8._32_8_,local_d8._48_8_ + 1);
    }
    paVar5 = &local_50.field_2;
    pcVar1 = (instruction->_M_dataplus)._M_p;
    local_50._M_dataplus._M_p = (pointer)paVar5;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_50,pcVar1,pcVar1 + instruction->_M_string_length);
    instr5Bytes(this,&local_50,reg + 0xf,0,iVar3);
    _Var4._M_p = local_50._M_dataplus._M_p;
  }
  else {
    pcVar1 = (operand->_M_dataplus)._M_p;
    local_d8._0_8_ = local_d8 + 0x10;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_d8,pcVar1,pcVar1 + operand->_M_string_length);
    iVar3 = literalToDecimal(this_00,(string *)local_d8);
    if ((undefined1 *)local_d8._0_8_ != local_d8 + 0x10) {
      operator_delete((void *)local_d8._0_8_,local_d8._16_8_ + 1);
    }
    paVar5 = &local_70.field_2;
    pcVar1 = (instruction->_M_dataplus)._M_p;
    local_70._M_dataplus._M_p = (pointer)paVar5;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_70,pcVar1,pcVar1 + instruction->_M_string_length);
    instr5Bytes(this,&local_70,reg + 0xf,0,iVar3);
    _Var4._M_p = local_70._M_dataplus._M_p;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_Var4._M_p != paVar5) {
    operator_delete(_Var4._M_p,paVar5->_M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void Assembler::processLdStrAbsolute(string instruction, int reg, string operand) {
    int regs = reg + 0xF;
    int adr = 0;
    int value;
    if (regex_match(operand, symbolReg)) {
        value = processAbsoluteAddressingSymbol(operand);
        instr5Bytes(instruction, regs, adr, value);
    } else {
        value = literalToDecimal(operand);
        instr5Bytes(instruction, regs, adr, value);
    }
    return;
}